

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

type fmt::v5::
     visit_format_arg<fmt::v5::internal::arg_converter<long_long,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (arg_converter<long_long,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                *vis,basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     *arg)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *pbVar4;
  ulong uVar5;
  assertion_failure *this;
  
  switch(arg->type_) {
  case named_arg_type:
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"invalid argument type");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  case int_type:
    uVar3 = (arg->value_).field_0.int_value;
    uVar5 = (ulong)uVar3;
    if ((vis->type_ == 'i') || (vis->type_ == 'd')) {
      pbVar4 = vis->arg_;
      *(long *)&(pbVar4->value_).field_0 = (long)(int)uVar3;
      pbVar4->type_ = long_long_type;
      return;
    }
    goto LAB_00137b5c;
  case uint_type:
    uVar5 = (ulong)(arg->value_).field_0.uint_value;
    if ((vis->type_ == 'i') || (vis->type_ == 'd')) goto LAB_00137b13;
LAB_00137b5c:
    pbVar4 = vis->arg_;
    (pbVar4->value_).field_0.long_long_value = uVar5;
    pbVar4->type_ = uint_type;
    break;
  case long_long_type:
  case ulong_long_type:
    uVar5 = (arg->value_).field_0.long_long_value;
    if ((vis->type_ != 'i') && (vis->type_ != 'd')) {
      pbVar4 = vis->arg_;
      (pbVar4->value_).field_0.long_long_value = uVar5;
      pbVar4->type_ = ulong_long_type;
      return;
    }
LAB_00137b13:
    pbVar4 = vis->arg_;
    (pbVar4->value_).field_0.long_long_value = uVar5;
    pbVar4->type_ = long_long_type;
    break;
  case bool_type:
    iVar2 = (arg->value_).field_0.int_value;
    cVar1 = vis->type_;
    if (cVar1 != 'd') {
      if (cVar1 == 's') {
        return;
      }
      if (cVar1 != 'i') {
        pbVar4 = vis->arg_;
        *(ulong *)&(pbVar4->value_).field_0 = (ulong)(iVar2 != 0);
        pbVar4->type_ = bool_type;
        return;
      }
    }
    pbVar4 = vis->arg_;
    *(ulong *)&(pbVar4->value_).field_0 = (ulong)(iVar2 != 0);
    pbVar4->type_ = long_long_type;
    break;
  case char_type:
    internal::
    arg_converter<long_long,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
    ::operator()(vis,*(char *)&(arg->value_).field_0);
    return;
  }
  return;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}